

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Parser
parserCreate(XML_Char *encodingName,XML_Memory_Handling_Suite *memsuite,XML_Char *nameSep,DTD *dtd)

{
  _func_void_void_ptr *p_Var1;
  DTD *pDVar2;
  ENCODING *pEVar3;
  XML_Memory_Handling_Suite *mtemp_1;
  XML_Memory_Handling_Suite *mtemp;
  XML_Parser parser;
  DTD *dtd_local;
  XML_Char *nameSep_local;
  XML_Memory_Handling_Suite *memsuite_local;
  XML_Char *encodingName_local;
  
  if (memsuite == (XML_Memory_Handling_Suite *)0x0) {
    mtemp = (XML_Memory_Handling_Suite *)malloc(0x380);
    if (mtemp != (XML_Memory_Handling_Suite *)0x0) {
      mtemp[1].malloc_fcn = malloc;
      mtemp[1].realloc_fcn = realloc;
      mtemp[1].free_fcn = free;
    }
  }
  else {
    mtemp = (XML_Memory_Handling_Suite *)(*memsuite->malloc_fcn)(0x380);
    if (mtemp != (XML_Memory_Handling_Suite *)0x0) {
      mtemp[1].malloc_fcn = memsuite->malloc_fcn;
      mtemp[1].realloc_fcn = memsuite->realloc_fcn;
      mtemp[1].free_fcn = memsuite->free_fcn;
    }
  }
  if (mtemp == (XML_Memory_Handling_Suite *)0x0) {
    encodingName_local = (XML_Char *)mtemp;
  }
  else {
    mtemp->free_fcn = (_func_void_void_ptr *)0x0;
    mtemp[2].free_fcn = (_func_void_void_ptr *)0x0;
    *(undefined4 *)&mtemp[0x1d].malloc_fcn = 0x10;
    p_Var1 = (_func_void_void_ptr *)
             (*mtemp[1].malloc_fcn)((long)*(int *)&mtemp[0x1d].malloc_fcn << 5);
    mtemp[0x1d].free_fcn = p_Var1;
    if (mtemp[0x1d].free_fcn == (_func_void_void_ptr *)0x0) {
      (*mtemp[1].free_fcn)(mtemp);
      encodingName_local = (XML_Char *)0x0;
    }
    else {
      p_Var1 = (_func_void_void_ptr *)(*mtemp[1].malloc_fcn)(0x400);
      mtemp[3].free_fcn = p_Var1;
      if (mtemp[3].free_fcn == (_func_void_void_ptr *)0x0) {
        (*mtemp[1].free_fcn)(mtemp[0x1d].free_fcn);
        (*mtemp[1].free_fcn)(mtemp);
        encodingName_local = (XML_Char *)0x0;
      }
      else {
        mtemp[4].malloc_fcn = (_func_void_ptr_size_t *)(mtemp[3].free_fcn + 0x400);
        if (dtd == (DTD *)0x0) {
          pDVar2 = dtdCreate(mtemp + 1);
          mtemp[0x1b].malloc_fcn = (_func_void_ptr_size_t *)pDVar2;
          if (mtemp[0x1b].malloc_fcn == (_func_void_ptr_size_t *)0x0) {
            (*mtemp[1].free_fcn)(mtemp[3].free_fcn);
            (*mtemp[1].free_fcn)(mtemp[0x1d].free_fcn);
            (*mtemp[1].free_fcn)(mtemp);
            return (XML_Parser)0x0;
          }
        }
        else {
          mtemp[0x1b].malloc_fcn = (_func_void_ptr_size_t *)dtd;
        }
        mtemp[0x1c].free_fcn = (_func_void_void_ptr *)0x0;
        mtemp[0x1c].malloc_fcn = (_func_void_ptr_size_t *)0x0;
        mtemp[0x17].malloc_fcn = (_func_void_ptr_size_t *)0x0;
        *(undefined4 *)&mtemp[0x24].malloc_fcn = 0;
        mtemp[0x23].free_fcn = (_func_void_void_ptr *)0x0;
        mtemp[10].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
        mtemp[0x13].free_fcn = (_func_void_void_ptr *)0x0;
        *(undefined1 *)((long)&mtemp[0x24].malloc_fcn + 4) = 0x21;
        *(undefined1 *)&mtemp[0x12].free_fcn = 0;
        *(undefined1 *)((long)&mtemp[0x12].free_fcn + 1) = 0;
        mtemp[0x1e].malloc_fcn = (_func_void_ptr_size_t *)0x0;
        mtemp[0x1e].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
        *(undefined1 *)&mtemp[0x1e].free_fcn = 0;
        mtemp[0x12].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
        poolInit((STRING_POOL *)&mtemp[0x1f].free_fcn,mtemp + 1);
        poolInit((STRING_POOL *)&mtemp[0x21].free_fcn,mtemp + 1);
        parserInit((XML_Parser)mtemp,encodingName);
        if ((encodingName == (XML_Char *)0x0) ||
           (mtemp[0x12].realloc_fcn != (_func_void_ptr_void_ptr_size_t *)0x0)) {
          if (nameSep == (XML_Char *)0x0) {
            pEVar3 = XmlGetUtf8InternalEncoding();
            mtemp[0x12].malloc_fcn = (_func_void_ptr_size_t *)pEVar3;
          }
          else {
            *(undefined1 *)&mtemp[0x12].free_fcn = 1;
            pEVar3 = XmlGetUtf8InternalEncoding();
            mtemp[0x12].malloc_fcn = (_func_void_ptr_size_t *)pEVar3;
            *(XML_Char *)((long)&mtemp[0x24].malloc_fcn + 4) = *nameSep;
          }
          encodingName_local = (XML_Char *)mtemp;
        }
        else {
          XML_ParserFree((XML_Parser)mtemp);
          encodingName_local = (XML_Char *)0x0;
        }
      }
    }
  }
  return (XML_Parser)encodingName_local;
}

Assistant:

static XML_Parser
parserCreate(const XML_Char *encodingName,
             const XML_Memory_Handling_Suite *memsuite, const XML_Char *nameSep,
             DTD *dtd) {
  XML_Parser parser;

  if (memsuite) {
    XML_Memory_Handling_Suite *mtemp;
    parser = memsuite->malloc_fcn(sizeof(struct XML_ParserStruct));
    if (parser != NULL) {
      mtemp = (XML_Memory_Handling_Suite *)&(parser->m_mem);
      mtemp->malloc_fcn = memsuite->malloc_fcn;
      mtemp->realloc_fcn = memsuite->realloc_fcn;
      mtemp->free_fcn = memsuite->free_fcn;
    }
  } else {
    XML_Memory_Handling_Suite *mtemp;
    parser = (XML_Parser)malloc(sizeof(struct XML_ParserStruct));
    if (parser != NULL) {
      mtemp = (XML_Memory_Handling_Suite *)&(parser->m_mem);
      mtemp->malloc_fcn = malloc;
      mtemp->realloc_fcn = realloc;
      mtemp->free_fcn = free;
    }
  }

  if (! parser)
    return parser;

  parser->m_buffer = NULL;
  parser->m_bufferLim = NULL;

  parser->m_attsSize = INIT_ATTS_SIZE;
  parser->m_atts
      = (ATTRIBUTE *)MALLOC(parser, parser->m_attsSize * sizeof(ATTRIBUTE));
  if (parser->m_atts == NULL) {
    FREE(parser, parser);
    return NULL;
  }
#ifdef XML_ATTR_INFO
  parser->m_attInfo = (XML_AttrInfo *)MALLOC(
      parser, parser->m_attsSize * sizeof(XML_AttrInfo));
  if (parser->m_attInfo == NULL) {
    FREE(parser, parser->m_atts);
    FREE(parser, parser);
    return NULL;
  }
#endif
  parser->m_dataBuf
      = (XML_Char *)MALLOC(parser, INIT_DATA_BUF_SIZE * sizeof(XML_Char));
  if (parser->m_dataBuf == NULL) {
    FREE(parser, parser->m_atts);
#ifdef XML_ATTR_INFO
    FREE(parser, parser->m_attInfo);
#endif
    FREE(parser, parser);
    return NULL;
  }
  parser->m_dataBufEnd = parser->m_dataBuf + INIT_DATA_BUF_SIZE;

  if (dtd)
    parser->m_dtd = dtd;
  else {
    parser->m_dtd = dtdCreate(&parser->m_mem);
    if (parser->m_dtd == NULL) {
      FREE(parser, parser->m_dataBuf);
      FREE(parser, parser->m_atts);
#ifdef XML_ATTR_INFO
      FREE(parser, parser->m_attInfo);
#endif
      FREE(parser, parser);
      return NULL;
    }
  }

  parser->m_freeBindingList = NULL;
  parser->m_freeTagList = NULL;
  parser->m_freeInternalEntities = NULL;

  parser->m_groupSize = 0;
  parser->m_groupConnector = NULL;

  parser->m_unknownEncodingHandler = NULL;
  parser->m_unknownEncodingHandlerData = NULL;

  parser->m_namespaceSeparator = ASCII_EXCL;
  parser->m_ns = XML_FALSE;
  parser->m_ns_triplets = XML_FALSE;

  parser->m_nsAtts = NULL;
  parser->m_nsAttsVersion = 0;
  parser->m_nsAttsPower = 0;

  parser->m_protocolEncodingName = NULL;

  poolInit(&parser->m_tempPool, &(parser->m_mem));
  poolInit(&parser->m_temp2Pool, &(parser->m_mem));
  parserInit(parser, encodingName);

  if (encodingName && ! parser->m_protocolEncodingName) {
    XML_ParserFree(parser);
    return NULL;
  }

  if (nameSep) {
    parser->m_ns = XML_TRUE;
    parser->m_internalEncoding = XmlGetInternalEncodingNS();
    parser->m_namespaceSeparator = *nameSep;
  } else {
    parser->m_internalEncoding = XmlGetInternalEncoding();
  }

  return parser;
}